

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O0

int __thiscall xmrig::CudaBackendPrivate::init(CudaBackendPrivate *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  uint uVar2;
  int extraout_EAX_00;
  uint32_t uVar3;
  int extraout_EAX_01;
  int iVar4;
  int32_t bsleep;
  int32_t bfactor;
  int extraout_EAX_02;
  uint32_t uVar5;
  uint32_t uVar6;
  String *pSVar7;
  EVP_PKEY_CTX *pEVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char *pcVar11;
  undefined7 extraout_var_00;
  reference this_00;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  size_t sVar15;
  int __c;
  CudaDevice **__s;
  CudaDevice *device;
  iterator __end2;
  iterator __begin2;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *__range2;
  uint32_t in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  uint32_t in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  PciTopology *in_stack_fffffffffffffeb8;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff08;
  undefined *puVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff30;
  CudaDevice *local_a0;
  __normal_iterator<xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
  local_98;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *local_90;
  string local_78 [32];
  string local_58 [56];
  CudaConfig *local_20;
  CudaBackendPrivate *local_18;
  undefined7 extraout_var;
  
  uVar5 = (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_20 = (CudaConfig *)ctx;
  local_18 = this;
  bVar1 = CudaConfig::isEnabled((CudaConfig *)ctx);
  if (bVar1) {
    pSVar7 = CudaConfig::loader(local_20);
    pEVar8 = (EVP_PKEY_CTX *)String::operator_cast_to_char_(pSVar7);
    uVar2 = CudaLib::init(pEVar8);
    if ((uVar2 & 1) == 0) {
      printDisabled((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                    (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      iVar4 = extraout_EAX_00;
    }
    else {
      uVar3 = CudaLib::runtimeVersion();
      this->runtimeVersion = uVar3;
      uVar3 = CudaLib::driverVersion();
      this->driverVersion = uVar3;
      if (((this->runtimeVersion == 0) || (this->driverVersion == 0)) ||
         (uVar3 = CudaLib::deviceCount(), uVar3 == 0)) {
        printDisabled((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                      (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        iVar4 = extraout_EAX_01;
      }
      else {
        bVar1 = std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::empty
                          ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)
                           CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        iVar4 = (int)CONCAT71(extraout_var,bVar1);
        if (bVar1) {
          bsleep = CudaConfig::bfactor(local_20);
          bfactor = CudaConfig::bsleep(local_20);
          CudaConfig::devicesHint(local_20);
          CudaLib::devices(bfactor,bsleep,in_stack_ffffffffffffff30);
          std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::operator=
                    ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)
                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)
                     CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::~vector
                    ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)
                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          bVar1 = std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::empty
                            ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)
                             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          puVar16 = kLabel;
          if (bVar1) {
            printDisabled((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            iVar4 = extraout_EAX_02;
          }
          else {
            CudaLib::version_abi_cxx11_(uVar5);
            uVar9 = std::__cxx11::string::c_str();
            CudaLib::version_abi_cxx11_(uVar5);
            uVar10 = std::__cxx11::string::c_str();
            pcVar11 = CudaLib::pluginVersion();
            Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;37m%s\x1b[0m/\x1b[1;37m%s\x1b[0m\x1b[1;30m/%s\x1b[0m"
                       ,puVar16,uVar9,uVar10,pcVar11);
            std::__cxx11::string::~string(local_78);
            std::__cxx11::string::~string(local_58);
            bVar1 = CudaConfig::isNvmlEnabled(local_20);
            if (bVar1) {
              pSVar7 = CudaConfig::nvmlLoader(local_20);
              pEVar8 = (EVP_PKEY_CTX *)String::operator_cast_to_char_(pSVar7);
              uVar2 = NvmlLib::init(pEVar8);
              if ((uVar2 & 1) == 0) {
                printDisabled((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
                ;
              }
              else {
                NvmlLib::assign(in_stack_fffffffffffffef8);
                puVar16 = kNvmlLabel;
                pcVar11 = NvmlLib::version();
                pcVar12 = NvmlLib::driverVersion();
                Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;37m%s\x1b[0m/\x1b[1;32m%s\x1b[0m press \x1b[45m\x1b[1;37me\x1b[0m for health report"
                           ,puVar16,pcVar11,pcVar12);
              }
            }
            else {
              printDisabled((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            }
            local_90 = &this->devices;
            local_98._M_current =
                 (CudaDevice *)
                 std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::begin
                           ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)
                            CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            local_a0 = (CudaDevice *)
                       std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::end
                                 ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)
                                  CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            while( true ) {
              __s = &local_a0;
              bVar1 = __gnu_cxx::operator!=
                                ((__normal_iterator<xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                 (__normal_iterator<xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
              iVar4 = (int)CONCAT71(extraout_var_00,bVar1);
              if (!bVar1) break;
              this_00 = __gnu_cxx::
                        __normal_iterator<xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
                        ::operator*(&local_98);
              pcVar11 = CudaDevice::index(this_00,(char *)__s,__c);
              CudaDevice::topology(this_00);
              PciTopology::toString(in_stack_fffffffffffffeb8);
              pcVar12 = String::data((String *)&stack0xffffffffffffff48);
              pSVar7 = CudaDevice::name(this_00);
              pcVar13 = String::data(pSVar7);
              uVar14 = CudaDevice::clock(this_00);
              in_stack_fffffffffffffe88 = CudaDevice::memoryClock((CudaDevice *)0x225017);
              uVar5 = CudaDevice::smx((CudaDevice *)0x22502a);
              uVar3 = CudaDevice::computeCapability
                                ((CudaDevice *)
                                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                 SUB41((uint)in_stack_fffffffffffffe8c >> 0x18,0));
              uVar6 = CudaDevice::computeCapability
                                ((CudaDevice *)
                                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                 SUB41((uint)in_stack_fffffffffffffe8c >> 0x18,0));
              sVar15 = CudaDevice::freeMemSize((CudaDevice *)0x22506a);
              in_stack_fffffffffffffeb8 = (PciTopology *)(sVar15 >> 0x14);
              sVar15 = CudaDevice::globalMemSize((CudaDevice *)0x22508c);
              Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;36m#%zu\x1b[0m\x1b[0;33m %s\x1b[0m\x1b[1;32m %s \x1b[0m\x1b[1;37m%u/%u MHz\x1b[0m smx:\x1b[1;37m%u\x1b[0m arch:\x1b[1;37m%u%u\x1b[0m mem:\x1b[0;36m%zu/%zu\x1b[0m MB"
                         ,"CUDA GPU",(ulong)pcVar11 & 0xffffffff,pcVar12,pcVar13,uVar14 & 0xffffffff
                         ,in_stack_fffffffffffffe88,uVar5,uVar3,uVar6,in_stack_fffffffffffffeb8,
                         sVar15 >> 0x14);
              String::~String((String *)CONCAT44(in_stack_fffffffffffffe94,uVar5));
              __gnu_cxx::
              __normal_iterator<xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
              ::operator++(&local_98);
              in_stack_fffffffffffffe90 = uVar5;
            }
          }
        }
      }
    }
  }
  else {
    printDisabled((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                  (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    iVar4 = extraout_EAX;
  }
  return iVar4;
}

Assistant:

void init(const CudaConfig &cuda)
    {
        if (!cuda.isEnabled()) {
            return printDisabled(kLabel, "");
        }

        if (!CudaLib::init(cuda.loader())) {
            return printDisabled(kLabel, RED_S " (failed to load CUDA plugin)");
        }

        runtimeVersion = CudaLib::runtimeVersion();
        driverVersion  = CudaLib::driverVersion();

        if (!runtimeVersion || !driverVersion || !CudaLib::deviceCount()) {
            return printDisabled(kLabel, RED_S " (no devices)");
        }

        if (!devices.empty()) {
            return;
        }

        devices = CudaLib::devices(cuda.bfactor(), cuda.bsleep(), cuda.devicesHint());
        if (devices.empty()) {
            return printDisabled(kLabel, RED_S " (no devices)");
        }

        Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") WHITE_BOLD("%s") "/" WHITE_BOLD("%s") BLACK_BOLD("/%s"), kLabel,
                   CudaLib::version(runtimeVersion).c_str(), CudaLib::version(driverVersion).c_str(), CudaLib::pluginVersion());

#       ifdef XMRIG_FEATURE_NVML
        if (cuda.isNvmlEnabled()) {
            if (NvmlLib::init(cuda.nvmlLoader())) {
                NvmlLib::assign(devices);

                Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") WHITE_BOLD("%s") "/" GREEN_BOLD("%s") " press " MAGENTA_BG(WHITE_BOLD_S "e") " for health report",
                           kNvmlLabel,
                           NvmlLib::version(),
                           NvmlLib::driverVersion()
                           );
            }
            else {
                printDisabled(kNvmlLabel, RED_S " (failed to load NVML)");
            }
        }
        else {
            printDisabled(kNvmlLabel, "");
        }
#       endif

        for (const CudaDevice &device : devices) {
            Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") CYAN_BOLD("#%zu") YELLOW(" %s") GREEN_BOLD(" %s ") WHITE_BOLD("%u/%u MHz") " smx:" WHITE_BOLD("%u") " arch:" WHITE_BOLD("%u%u") " mem:" CYAN("%zu/%zu") " MB",
                       "CUDA GPU",
                       device.index(),
                       device.topology().toString().data(),
                       device.name().data(),
                       device.clock(),
                       device.memoryClock(),
                       device.smx(),
                       device.computeCapability(true),
                       device.computeCapability(false),
                       device.freeMemSize() / oneMiB,
                       device.globalMemSize() / oneMiB);
        }
    }